

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::InternalSwap
          (ItemSimilarityRecommender_SimilarItems *this,
          ItemSimilarityRecommender_SimilarItems *other)

{
  ItemSimilarityRecommender_SimilarItems *other_local;
  ItemSimilarityRecommender_SimilarItems *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->similaritemlist_).super_RepeatedPtrFieldBase,
             &(other->similaritemlist_).super_RepeatedPtrFieldBase);
  std::swap<unsigned_long>(&this->itemid_,&other->itemid_);
  std::swap<double>(&this->itemscoreadjustment_,&other->itemscoreadjustment_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ItemSimilarityRecommender_SimilarItems::InternalSwap(ItemSimilarityRecommender_SimilarItems* other) {
  similaritemlist_.InternalSwap(&other->similaritemlist_);
  std::swap(itemid_, other->itemid_);
  std::swap(itemscoreadjustment_, other->itemscoreadjustment_);
  std::swap(_cached_size_, other->_cached_size_);
}